

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O2

Nonnull<const_char_*>
absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char_const*,unsigned_char_const*>
          (uchar *v1,uchar *v2,Nonnull<const_char_*> exprtext)

{
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  uchar *local_198;
  uchar *local_190;
  CheckOpMessageBuilder local_188;
  
  local_198 = v2;
  local_190 = v1;
  CheckOpMessageBuilder::CheckOpMessageBuilder(&local_188,exprtext);
  MakeCheckOpValueString<unsigned_char_const*>((ostream *)&local_188,&local_190);
  CheckOpMessageBuilder::ForVar2(&local_188);
  MakeCheckOpValueString<unsigned_char_const*>((ostream *)&local_188,&local_198);
  pcVar1 = CheckOpMessageBuilder::NewString(&local_188);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}